

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<TPZFlopCounter>::SolveSOR
          (TPZMatrix<TPZFlopCounter> *this,int64_t *numiterations,TPZFMatrix<TPZFlopCounter> *F,
          TPZFMatrix<TPZFlopCounter> *result,TPZFMatrix<TPZFlopCounter> *residual,
          TPZFMatrix<TPZFlopCounter> *param_6,REAL overrelax,REAL *tol,int FromCurrent,int direction
          )

{
  TPZFlopCounter *this_00;
  long *in_RCX;
  TPZBaseMatrix *in_RDX;
  long *in_RSI;
  TPZFlopCounter *in_RDI;
  TPZBaseMatrix *in_R8;
  double extraout_XMM0_Qa;
  double dVar1;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double *in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int64_t j;
  int64_t ic;
  TPZFlopCounter eqres;
  int64_t it;
  int64_t iinc;
  int64_t ilast;
  int64_t ifirst;
  int64_t i;
  int64_t c;
  int64_t r;
  TPZFlopCounter res;
  TPZFMatrix<TPZFlopCounter> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 uVar2;
  double in_stack_fffffffffffffee0;
  int64_t in_stack_fffffffffffffee8;
  TPZFlopCounter in_stack_fffffffffffffef0;
  TPZFlopCounter local_100;
  TPZFlopCounter local_f8;
  undefined8 local_f0;
  TPZFlopCounter local_e8;
  long local_e0;
  long local_d0;
  double local_c8;
  TPZFlopCounter local_c0;
  TPZFlopCounter local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  int64_t local_88;
  long local_80;
  REAL local_78;
  double local_70;
  TPZFlopCounter local_68;
  TPZFlopCounter local_60;
  double local_58;
  TPZFlopCounter local_50;
  REAL local_48;
  TPZFlopCounter local_40;
  double local_38 [2];
  TPZBaseMatrix *local_28;
  long *local_20;
  TPZBaseMatrix *local_18;
  long *local_10;
  
  if (in_R8 == in_RDX) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  }
  else {
    local_58 = 2.0;
    local_28 = in_R8;
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    TPZFlopCounter::TPZFlopCounter(&local_50,&local_58);
    TPZFlopCounter::TPZFlopCounter(&local_60,in_stack_00000008);
    local_48 = (REAL)TPZFlopCounter::operator*
                               (in_RDI,(TPZFlopCounter *)
                                       CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0)
                               );
    local_70 = 1.0;
    TPZFlopCounter::TPZFlopCounter(&local_68,&local_70);
    local_40 = TPZFlopCounter::operator+
                         (in_RDI,(TPZFlopCounter *)
                                 CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    if (local_28 != (TPZBaseMatrix *)0x0) {
      local_78 = (REAL)::Norm(in_stack_fffffffffffffec8);
      local_40 = (TPZFlopCounter)local_78;
    }
    if (in_stack_00000010 == 0) {
      (**(code **)(*local_20 + 0x78))();
    }
    local_80 = (**(code **)((long)in_RDI->fVal + 0x60))();
    local_88 = TPZBaseMatrix::Cols(local_18);
    local_98 = 0;
    local_a0 = local_80;
    local_a8 = 1;
    if (in_stack_00000018 == -1) {
      local_98 = local_80 + -1;
      local_a0 = -1;
      local_a8 = -1;
    }
    TPZFlopCounter::TPZFlopCounter(&local_b8);
    local_b0 = 0;
    dVar1 = extraout_XMM0_Qa;
    while( true ) {
      uVar2 = false;
      if (local_b0 < *local_10) {
        dVar1 = fabs(dVar1);
        uVar2 = ABS(*in_stack_00000008) < dVar1;
      }
      if ((bool)uVar2 == false) break;
      local_c8 = 0.0;
      TPZFlopCounter::TPZFlopCounter(&local_c0,&local_c8);
      local_40.fVal = local_c0.fVal;
      dVar1 = extraout_XMM0_Qa_00;
      for (local_d0 = 0; local_d0 < local_88; local_d0 = local_d0 + 1) {
        for (local_90 = local_98; local_90 != local_a0; local_90 = local_a8 + local_90) {
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(local_18,local_90,local_d0);
          for (local_e0 = 0; local_e0 < local_80; local_e0 = local_e0 + 1) {
            local_f0 = (**(code **)((long)in_RDI->fVal + 0x120))(in_RDI,local_90,local_e0);
            TPZFMatrix<TPZFlopCounter>::operator()
                      ((TPZFMatrix<TPZFlopCounter> *)in_stack_fffffffffffffef0.fVal,
                       in_stack_fffffffffffffee8,(int64_t)in_stack_fffffffffffffee0);
            local_e8 = TPZFlopCounter::operator*
                                 (in_RDI,(TPZFlopCounter *)CONCAT17(uVar2,in_stack_fffffffffffffed0)
                                 );
            TPZFlopCounter::operator-=(&local_b8,&local_e8);
          }
          local_f8 = TPZFlopCounter::operator*
                               (in_RDI,(TPZFlopCounter *)CONCAT17(uVar2,in_stack_fffffffffffffed0));
          TPZFlopCounter::operator+=(&local_40,&local_f8);
          TPZFlopCounter::TPZFlopCounter((TPZFlopCounter *)&stack0xfffffffffffffef0,local_38);
          TPZFlopCounter::operator*
                    (in_RDI,(TPZFlopCounter *)CONCAT17(uVar2,in_stack_fffffffffffffed0));
          in_stack_fffffffffffffee8 =
               (**(code **)((long)in_RDI->fVal + 0x120))(in_RDI,local_90,local_90);
          local_100 = TPZFlopCounter::operator/
                                (in_RDI,(TPZFlopCounter *)CONCAT17(uVar2,in_stack_fffffffffffffed0))
          ;
          this_00 = TPZFMatrix<TPZFlopCounter>::operator()
                              ((TPZFMatrix<TPZFlopCounter> *)in_stack_fffffffffffffef0.fVal,
                               in_stack_fffffffffffffee8,(int64_t)in_stack_fffffffffffffee0);
          TPZFlopCounter::operator+=(this_00,&local_100);
          dVar1 = extraout_XMM0_Qa_01;
        }
      }
      dVar1 = sqrt(dVar1);
      local_b0 = local_b0 + 1;
      in_stack_fffffffffffffee0 = dVar1;
      local_40.fVal = dVar1;
    }
    if (local_28 != (TPZBaseMatrix *)0x0) {
      dVar1 = (double)(**(code **)((long)in_RDI->fVal + 0x140))(in_RDI,local_20,local_18,local_28);
    }
    *local_10 = local_b0;
    dVar1 = fabs(dVar1);
    *in_stack_00000008 = dVar1;
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}